

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O1

int zeromult2(int i)

{
  symboltype sVar1;
  uint uVar2;
  float fVar3;
  
  uVar2 = 0;
  if (intcode[i].opcode == opmult) {
    sVar1 = symclass(intcode[i].op3.opnd);
    uVar2 = 0;
    if (sVar1 == stliteral) {
      fVar3 = getvalue(intcode[i].op3.opnd);
      uVar2 = -(uint)(fVar3 == 0.0) & 1;
    }
  }
  return uVar2;
}

Assistant:

int	zeromult2(int i)
{
    return((intcode[i].opcode == opmult
            && symclass(intcode[i].op3.opnd) == stliteral
            && getvalue(intcode[i].op3.opnd) == 0)? TRUE
           : FALSE);
}